

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmGlobalUnixMakefileGenerator3::cmGlobalUnixMakefileGenerator3
          (cmGlobalUnixMakefileGenerator3 *this,cmake *cm)

{
  cmake *cm_local;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  cmGlobalCommonGenerator::cmGlobalCommonGenerator(&this->super_cmGlobalCommonGenerator,cm);
  (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator =
       (_func_int **)&PTR__cmGlobalUnixMakefileGenerator3_011c75d0;
  std::__cxx11::string::string((string *)&this->IncludeDirective);
  std::__cxx11::string::string((string *)&this->LineContinueDirective);
  this->ToolSupportsCompilerDependencies = true;
  this->ToolSupportsLongLineDependencies = true;
  std::__cxx11::string::string((string *)&this->EmptyRuleHackDepends);
  std::__cxx11::string::string((string *)&this->EmptyRuleHackCommand);
  std::
  map<const_cmGeneratorTarget_*,_cmGlobalUnixMakefileGenerator3::TargetProgress,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>_>
  ::map(&this->ProgressMap);
  std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>::
  unique_ptr<std::default_delete<cmGeneratedFileStream>,void>
            ((unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>> *)
             &this->CommandDatabase);
  std::
  map<cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
  ::map(&this->DirectoryTargetsMap);
  (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.ForceUnixPaths = true;
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.FindMakeProgramFile,
             "CMakeUnixFindMake.cmake");
  (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.ToolSupportsColor = true;
  (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.UseLinkScript = true;
  std::__cxx11::string::operator=((string *)&this->IncludeDirective,"include");
  std::__cxx11::string::operator=((string *)&this->LineContinueDirective,"\\\n");
  this->DefineWindowsNULL = false;
  this->PassMakeflags = false;
  this->UnixCD = true;
  return;
}

Assistant:

cmGlobalUnixMakefileGenerator3::cmGlobalUnixMakefileGenerator3(cmake* cm)
  : cmGlobalCommonGenerator(cm)
{
  // This type of makefile always requires unix style paths
  this->ForceUnixPaths = true;
  this->FindMakeProgramFile = "CMakeUnixFindMake.cmake";
  this->ToolSupportsColor = true;

#if defined(_WIN32) || defined(__VMS)
  this->UseLinkScript = false;
#else
  this->UseLinkScript = true;
#endif

  this->IncludeDirective = "include";
  this->LineContinueDirective = "\\\n";
  this->DefineWindowsNULL = false;
  this->PassMakeflags = false;
  this->UnixCD = true;
}